

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ExtensionSet::AddString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  bool bVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar2;
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  char *pcVar3;
  LogMessage *pLVar4;
  CppType *pCVar5;
  CppType *pCVar6;
  pointer pbVar7;
  LogMessage local_b0;
  Voidify local_99;
  CppType local_98;
  CppType local_94;
  Nullable<const_char_*> local_90;
  LogMessage local_88;
  Voidify local_71;
  anon_enum_32 local_70;
  anon_enum_32 local_6c;
  Nullable<const_char_*> local_68;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_50;
  Voidify local_39;
  CppType local_38;
  CppType local_34;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  FieldType type_local;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)descriptor;
  descriptor_local._3_1_ = type;
  descriptor_local._4_4_ = number;
  pEStack_10 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,(Extension **)&absl_log_internal_check_op_result)
  ;
  if (bVar1) {
    absl_log_internal_check_op_result[8] = descriptor_local._3_1_;
    local_34 = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
    pCVar5 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_34);
    local_38 = CPPTYPE_STRING;
    pCVar6 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_38);
    local_30 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (pCVar5,pCVar6,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_STRING");
    if (local_30 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_30);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x270,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_50);
    }
    absl_log_internal_check_op_result[9] = '\x01';
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfeU | 1;
    absl_log_internal_check_op_result[0xb] = '\0';
    pRVar2 = Arena::Create<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(this->arena_);
    *(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      **)absl_log_internal_check_op_result = pRVar2;
  }
  else {
    local_6c = (anon_enum_32)((absl_log_internal_check_op_result[9] & 1U) == 0);
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_6c);
    local_70 = REPEATED_FIELD;
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_70);
    local_68 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                         (v1,v2,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                         );
    if (local_68 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_68);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x277,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_71,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_88);
    }
    local_94 = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
    pCVar5 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_94);
    local_98 = CPPTYPE_STRING;
    pCVar6 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_98);
    local_90 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (pCVar5,pCVar6,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_STRING");
    if (local_90 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_90);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x277,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b0);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_99,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_b0);
    }
    local_90 = (Nullable<const_char_*>)0x0;
  }
  pbVar7 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add(*(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   **)absl_log_internal_check_op_result);
  return pbVar7;
}

Assistant:

std::string* ExtensionSet::AddString(int number, FieldType type,
                                     const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->is_packed = false;
    extension->ptr.repeated_string_value =
        Arena::Create<RepeatedPtrField<std::string>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, STRING);
  }
  return extension->ptr.repeated_string_value->Add();
}